

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filelist-parser.c
# Opt level: O3

bc_slist_t * blogc_filelist_parse(char *src,size_t src_len)

{
  byte c;
  int iVar1;
  bc_string_t *str;
  char *data;
  bc_slist_t *l;
  ulong uVar2;
  int iVar4;
  ulong uVar3;
  
  str = bc_string_new();
  if (src_len == 0) {
    l = (bc_slist_t *)0x0;
  }
  else {
    iVar1 = 1;
    uVar2 = 0;
    l = (bc_slist_t *)0x0;
    do {
      c = src[uVar2];
      uVar3 = uVar2;
      if (iVar1 == 1) {
        iVar1 = 2;
        if (c < 0x24) {
          iVar4 = 1;
          if ((0x100002600U >> ((ulong)c & 0x3f) & 1) == 0) {
            if ((ulong)c != 0x23) goto LAB_00103088;
            if (uVar2 < src_len) {
              do {
                uVar3 = uVar2;
                if ((src[uVar2] == '\n') || (src[uVar2] == '\r')) break;
                uVar2 = uVar2 + 1;
                uVar3 = src_len;
              } while (src_len != uVar2);
            }
          }
          goto LAB_00103082;
        }
      }
      else {
        if ((c == 10) || (c == 0xd)) {
          if (uVar2 == src_len - 1) goto LAB_0010303f;
        }
        else {
          if (uVar2 != src_len - 1) {
            bc_string_append_c(str,c);
            iVar4 = 2;
            goto LAB_00103082;
          }
LAB_0010303f:
          if ((c != 10) && (c != 0xd)) {
            bc_string_append_c(str,c);
          }
        }
        data = bc_str_strip(str->str);
        l = bc_slist_append(l,data);
        bc_string_free(str,false);
        str = bc_string_new();
        iVar4 = 1;
LAB_00103082:
        iVar1 = iVar4;
        uVar2 = uVar3 + 1;
      }
LAB_00103088:
    } while (uVar2 < src_len);
  }
  bc_string_free(str,true);
  return l;
}

Assistant:

bc_slist_t*
blogc_filelist_parse(const char *src, size_t src_len)
{
    size_t current = 0;
    bc_slist_t *rv = NULL;
    bc_string_t *line = bc_string_new();
    blogc_filelist_parser_state_t state = LINE_START;

    while (current < src_len) {
        char c = src[current];
        bool is_last = current == src_len - 1;

        switch (state) {

            case LINE_START:
                if (c == '#') {
                    while (current < src_len) {
                        if (src[current] == '\r' || src[current] == '\n')
                            break;
                        current++;
                    }
                    break;
                }
                if (c == ' ' || c == '\t' || c == '\r' || c == '\n')
                    break;
                state = LINE;
                continue;

            case LINE:
                if (c == '\r' || c == '\n' || is_last) {
                    if (is_last && c != '\r' && c != '\n')
                        bc_string_append_c(line, c);
                    rv = bc_slist_append(rv, bc_str_strip(line->str));
                    bc_string_free(line, false);
                    line = bc_string_new();
                    state = LINE_START;
                    break;
                }
                bc_string_append_c(line, c);
                break;

        }

        current++;
    }

    bc_string_free(line, true);

    return rv;
}